

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch_fixed.cpp
# Opt level: O3

void authenticate_and_launch(void)

{
  char response [8];
  undefined4 local_10;
  undefined3 uStack_c;
  
  printf("Secret: ");
  *(undefined8 *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) = 8;
  std::__istream_extract((istream *)&std::cin,(char *)&local_10,8);
  if (CONCAT31(uStack_c,local_10._3_1_) == 0x617568 && local_10 == 0x68736f4a) {
    puts("Access granted");
    printf("Launching %d missiles\n",2);
  }
  else {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch() {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  size_t max = sizeof response;
  std::cin >> std::setw(max) >> response;

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}